

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O2

string * __thiscall
cfd::core::DescriptorNode::ToString_abi_cxx11_
          (string *__return_storage_ptr__,DescriptorNode *this,bool append_checksum)

{
  pointer pDVar1;
  bool bVar2;
  string *extraout_RDX;
  string *extraout_RDX_00;
  string *psVar3;
  DescriptorNode *child;
  pointer this_00;
  string child_text;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  child_text._M_dataplus._M_p = "cfdcore_descriptor.cpp";
  child_text._M_string_length = CONCAT44(child_text._M_string_length._4_4_,0x7b7);
  child_text.field_2._M_allocated_capacity = (long)"DecryptAes256ToString" + 0xd;
  logger::info<std::__cxx11::string_const&,std::__cxx11::string_const&>
            ((CfdSourceLocation *)&child_text,"name={}, value={}",&this->name_,&this->value_);
  if ((this->name_)._M_string_length != 0) {
    bVar2 = ::std::operator==(&this->name_,"miniscript");
    if (!bVar2) {
      if ((this->child_node_).
          super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          (this->child_node_).
          super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        ::std::operator+(&local_50,&this->name_,"(");
        ::std::operator+(&local_70,&local_50,&this->value_);
        ::std::operator+(&child_text,&local_70,")");
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&child_text);
        ::std::__cxx11::string::~string((string *)&child_text);
        ::std::__cxx11::string::~string((string *)&local_70);
        psVar3 = &local_50;
      }
      else {
        ::std::operator+(&child_text,&this->name_,"(");
        ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&child_text);
        ::std::__cxx11::string::~string((string *)&child_text);
        child_text._M_dataplus._M_p = (pointer)&child_text.field_2;
        child_text._M_string_length = 0;
        child_text.field_2._M_allocated_capacity =
             child_text.field_2._M_allocated_capacity & 0xffffffffffffff00;
        pDVar1 = (this->child_node_).
                 super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (this_00 = (this->child_node_).
                       super__Vector_base<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>
                       ._M_impl.super__Vector_impl_data._M_start; this_00 != pDVar1;
            this_00 = this_00 + 1) {
          if (child_text._M_string_length != 0) {
            ::std::__cxx11::string::append((char *)&child_text);
          }
          ToString_abi_cxx11_(&local_70,this_00,true);
          ::std::__cxx11::string::append((string *)&child_text);
          ::std::__cxx11::string::~string((string *)&local_70);
        }
        ::std::operator+(&local_70,&child_text,")");
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&local_70);
        psVar3 = &child_text;
      }
      ::std::__cxx11::string::~string((string *)psVar3);
      psVar3 = extraout_RDX_00;
      goto LAB_001bd417;
    }
  }
  ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  psVar3 = extraout_RDX;
LAB_001bd417:
  if (append_checksum && this->depth_ == 0) {
    GenerateChecksum(&child_text,(DescriptorNode *)__return_storage_ptr__,psVar3);
    if (child_text._M_string_length != 0) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    ::std::__cxx11::string::~string((string *)&child_text);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DescriptorNode::ToString(bool append_checksum) const {
  std::string result;
  info(CFD_LOG_SOURCE, "name={}, value={}", name_, value_);

  if (name_.empty() || (name_ == "miniscript")) {
    result = value_;
  } else if (child_node_.empty()) {
    result = name_ + "(" + value_ + ")";
  } else {
    result = name_ + "(";
    std::string child_text;
    for (const auto& child : child_node_) {
      if (!child_text.empty()) child_text += ",";
      child_text += child.ToString();
    }
    result += child_text + ")";
  }

  if ((depth_ == 0) && append_checksum) {
    std::string checksum = GenerateChecksum(result);
    if (!checksum.empty()) {
      result += "#";
      result += checksum;
    }
  }
  return result;
}